

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  stringstream *psVar2;
  char *in_RDX;
  Int32 IVar3;
  Int32 result;
  string env_var;
  Int32 local_74;
  string local_70;
  string local_50;
  
  FlagToEnvVar_abi_cxx11_(&local_70,(internal *)flag,in_RDX);
  str = getenv(local_70._M_dataplus._M_p);
  IVar3 = default_value;
  if (str != (char *)0x0) {
    local_74 = default_value;
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + 0x18 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18)) = 0x11;
    local_50._M_dataplus._M_p = (pointer)psVar2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(psVar2 + 0x10),"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(psVar2 + 0x10),local_70._M_dataplus._M_p,local_70._M_string_length);
    bVar1 = ParseInt32((Message *)&local_50,str,&local_74);
    (**(code **)(*(long *)psVar2 + 8))(psVar2);
    IVar3 = local_74;
    if (!bVar1) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      std::ostream::operator<<((ostream *)(psVar2 + 0x10),default_value);
      StringStreamToString(&local_50,(stringstream *)psVar2);
      printf("The default value %s is used.\n",local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(*(long *)psVar2 + 8))(psVar2);
      fflush(_stdout);
      IVar3 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return IVar3;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}